

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importParser.h
# Opt level: O0

void __thiscall sqimportparser::ImportParser::skipSpaceAndComments(ImportParser *this)

{
  bool bVar1;
  bool bVar2;
  ImportParser *in_RDI;
  bool bVar3;
  char *from;
  char *commentFrom;
  bool insideComment;
  bool repeat;
  value_type *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  
  bVar1 = true;
  bVar2 = false;
  while (bVar1) {
    bVar1 = false;
    while( true ) {
      bVar3 = false;
      if ((((*in_RDI->p != '\0') && (bVar3 = true, *in_RDI->p != ' ')) &&
          (bVar3 = true, *in_RDI->p != '\t')) &&
         (((bVar3 = true, *in_RDI->p != '\r' && (bVar3 = true, *in_RDI->p != '\n')) &&
          ((bVar3 = true, !bVar2 && (bVar3 = false, *in_RDI->p == '/')))))) {
        bVar3 = in_RDI->p[1] == '*';
      }
      if (!bVar3) break;
      if (((bVar2) || (*in_RDI->p != '/')) || (in_RDI->p[1] != '*')) {
        if (((bVar2) && (*in_RDI->p == '*')) && (in_RDI->p[1] == '/')) {
          bVar2 = false;
          in_RDI->p = in_RDI->p + 1;
          if (in_RDI->keepRanges !=
              (vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
               *)0x0) {
            std::make_pair<char_const*&,char_const*>
                      ((char **)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       &in_stack_ffffffffffffff88->first);
            std::
            vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
            ::push_back((vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
                         *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
          }
        }
      }
      else {
        bVar2 = true;
        in_RDI->p = in_RDI->p + 1;
      }
      nextChar(in_RDI);
    }
    if ((bVar2) && (*in_RDI->p == '\0')) {
      error((ImportParser *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
            (char *)in_stack_ffffffffffffff88);
    }
    if (((!bVar2) && (*in_RDI->p == '/')) && (in_RDI->p[1] == '/')) {
      bVar1 = true;
      do {
        in_stack_ffffffffffffff97 = false;
        if ((*in_RDI->p != '\0') && (in_stack_ffffffffffffff97 = false, *in_RDI->p != '\r')) {
          in_stack_ffffffffffffff97 = *in_RDI->p != '\n';
        }
      } while (((bool)in_stack_ffffffffffffff97 != false) && (bVar3 = nextChar(in_RDI), !bVar3));
      if (in_RDI->keepRanges !=
          (vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
           *)0x0) {
        in_stack_ffffffffffffff88 = (value_type *)in_RDI->keepRanges;
        std::make_pair<char_const*&,char_const*>
                  ((char **)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   (char **)in_stack_ffffffffffffff88);
        std::
        vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
        ::push_back((vector<std::pair<const_char_*,_const_char_*>,_std::allocator<std::pair<const_char_*,_const_char_*>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
      }
    }
  }
  return;
}

Assistant:

void skipSpaceAndComments()
  {
    bool repeat = true;
    bool insideComment = false;
    const char * commentFrom = nullptr;
    while (repeat)
    {
      repeat = false;
      while (*p && (*p == ' ' || *p == '\t' || *p == '\r' || *p == '\n' || insideComment || (*p == '/' && p[1] == '*')))
      {
        if (!insideComment && *p == '/' && p[1] == '*')
        {
          insideComment = true;
          commentFrom = p;
          p++;
        }
        else if (insideComment && *p == '*' && p[1] == '/')
        {
          insideComment = false;
          p++;

          if (keepRanges)
            keepRanges->push_back(MODULE_PARSE_STL::make_pair(commentFrom, p + 1));
        }
        nextChar();
      }

      if (insideComment && *p == 0)
        error("unexpected end of file inside comment");

      if (!insideComment && *p == '/' && p[1] == '/')
      {
        const char * from = p;
        repeat = true;
        while (*p && *p != '\r' && *p != '\n')
          if (nextChar())
            break;

        if (keepRanges)
          keepRanges->push_back(MODULE_PARSE_STL::make_pair(from, p + 1));
      }
    }
  }